

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O1

void __thiscall fs_tests::fsbridge_stem::test_method(fsbridge_stem *this)

{
  int iVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined1 auVar2 [16];
  lazy_ostream local_1d0;
  undefined1 *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  string *local_190;
  undefined **local_188;
  undefined1 local_180;
  undefined1 *local_178;
  string **local_170;
  string *local_168;
  char *local_160;
  char *local_158;
  assertion_result local_150;
  path local_138;
  path local_110;
  path local_e8;
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  string expected_stem;
  string test_filename;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  test_filename._M_dataplus._M_p = (pointer)&test_filename.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&test_filename,anon_var_dwarf_a26167,anon_var_dwarf_a26167 + 0x15);
  expected_stem._M_dataplus._M_p = (pointer)&expected_stem.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&expected_stem,anon_var_dwarf_a2600c,anon_var_dwarf_a2600c + 0x11);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2c;
  file.m_begin = (iterator)&local_1a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  local_1d0.m_empty = false;
  local_1d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_60,&test_filename,auto_format);
  std::filesystem::__cxx11::path::path(&local_138,(path *)local_60);
  std::filesystem::__cxx11::path::~path((path *)local_60);
  auVar2 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar2._8_8_ == 0 ||
      auVar2._0_8_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::filesystem::__cxx11::path::path(&local_110);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
               auVar2._0_8_,0,auVar2._8_8_);
    std::filesystem::__cxx11::path::path(&local_110,(string_type *)local_60,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._0_8_ != &local_50) {
      operator_delete((void *)local_60._0_8_,local_50._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path(&local_e8,&local_110);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,local_e8._M_pathname._M_dataplus._M_p,
             local_e8._M_pathname._M_dataplus._M_p + local_e8._M_pathname._M_string_length);
  if (local_b8 == expected_stem._M_string_length) {
    if (local_b8 == 0) {
      local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar1 = bcmp(local_c0,expected_stem._M_dataplus._M_p,local_b8);
      local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar1 == 0);
    }
  }
  else {
    local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_158 = "";
  local_50._8_8_ = &local_168;
  local_60[8] = 0;
  local_60._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_50._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_170 = &local_190;
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_013abbf0;
  local_178 = boost::unit_test::lazy_ostream::inst;
  local_190 = &expected_stem;
  local_168 = (string *)&local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_1d0,1,2,REQUIRE,0xe95f00,(size_t)&local_160,0x2c,(path *)local_60,
             "expected_stem",&local_188);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::filesystem::__cxx11::path::~path(&local_110);
  std::filesystem::__cxx11::path::~path(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expected_stem._M_dataplus._M_p != &expected_stem.field_2) {
    operator_delete(expected_stem._M_dataplus._M_p,expected_stem.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_filename._M_dataplus._M_p != &test_filename.field_2) {
    operator_delete(test_filename._M_dataplus._M_p,test_filename.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_stem)
{
    std::string test_filename = "fs_tests_₿_🏃.dat";
    std::string expected_stem = "fs_tests_₿_🏃";
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(test_filename).stem()), expected_stem);
}